

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__wrap_s____gles_sampler_wrap
          (ColladaParserAutoGen14Private *this)

{
  ParserChar **text;
  ColladaParserAutoGen14 *pCVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  StringHash SVar5;
  long lVar6;
  undefined1 uVar7;
  bool failed;
  
  text = &(this->
          super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
          ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData;
  SVar5 = GeneratedSaxParser::Utils::calculateStringHash
                    (text,(this->
                          super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                          ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack,&failed);
  lVar2 = 0;
  do {
    lVar6 = lVar2;
    if (lVar6 + 0x10 == 0x50) {
      failed = true;
      bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_TEXTDATA_PARSING_FAILED,0x7e88663,(ParserChar *)0x0,
                         (this->
                         super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                         ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData);
      uVar7 = !bVar3;
      goto LAB_006d9186;
    }
    lVar2 = lVar6 + 0x10;
  } while (*(StringHash *)((long)&ENUM__gles_sampler_wrapMap + lVar6) != SVar5);
  failed = false;
  pCVar1 = (this->
           super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
           ).mImpl;
  iVar4 = (*pCVar1->_vptr_ColladaParserAutoGen14[0x2b8])
                    (pCVar1,(ulong)*(uint *)((long)&DAT_0086c758 + lVar6));
  uVar7 = (undefined1)iVar4;
LAB_006d9186:
  if (*text != (ParserChar *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  *text = (ParserChar *)0x0;
  (this->
  super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
  ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack = (ParserChar *)0x0;
  return (bool)uVar7;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__wrap_s____gles_sampler_wrap()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__wrap_s____gles_sampler_wrap();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
ENUM__gles_sampler_wrap parameter = Utils::toEnum<ENUM__gles_sampler_wrap, StringHash, ENUM__gles_sampler_wrap__COUNT>((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed, ENUM__gles_sampler_wrapMap, Utils::calculateStringHash);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__wrap_s____gles_sampler_wrap(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_WRAP_S, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;

}